

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O2

void __thiscall displ::drawParticles(displ *this,vector<particle,_std::allocator<particle>_> *p)

{
  View *this_00;
  float fVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  pointer ppVar4;
  undefined8 uVar5;
  bool bVar6;
  Vector2f *pVVar7;
  Vector2u VVar8;
  Vector2u VVar9;
  Vector2f *pVVar10;
  int iVar11;
  RenderTarget *this_01;
  particle *i_1;
  pointer ppVar12;
  particle *i;
  float fVar13;
  float local_3a8;
  float fStack_3a4;
  float local_398;
  float fStack_394;
  undefined1 local_388 [16];
  FloatRect local_378;
  CircleShape circle;
  RectangleShape rectangle;
  
  this_01 = &(this->window).super_RenderTarget;
  sf::RenderTarget::clear(this_01,(Color *)&sf::Color::Black);
  circle.super_Shape.super_Drawable._vptr_Drawable = (_func_int **)0x0;
  sf::RectangleShape::RectangleShape(&rectangle,(Vector2f *)&circle);
  circle.super_Shape.super_Drawable._vptr_Drawable = *(_func_int ***)&this->box;
  sf::RectangleShape::setSize(&rectangle,(Vector2f *)&circle);
  sf::Shape::setOutlineColor(&rectangle.super_Shape,(Color *)&sf::Color::White);
  sf::Shape::setFillColor(&rectangle.super_Shape,(Color *)&sf::Color::Transparent);
  sf::Shape::setOutlineThickness(&rectangle.super_Shape,(this->box).x / 100.0);
  sf::RenderTarget::draw(this_01,(Drawable *)&rectangle,(RenderStates *)sf::RenderStates::Default);
  this_00 = &this->view;
  pVVar7 = sf::View::getSize(this_00);
  fVar13 = pVVar7->x;
  VVar8 = sf::RenderWindow::getSize(&this->window);
  pVVar7 = sf::View::getSize(this_00);
  fVar1 = pVVar7->y;
  VVar9 = sf::RenderWindow::getSize(&this->window);
  fVar13 = fVar1 / (float)((ulong)VVar9 >> 0x20) + fVar13 / (float)((ulong)VVar8 & 0xffffffff);
  if ((this->radius / fVar13) * 1.5 <= 1.0) {
    sf::Vertex::Vertex((Vertex *)&circle);
    ppVar4 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar12 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppVar12 != ppVar4; ppVar12 = ppVar12 + 1) {
      fVar13 = (ppVar12->velocity).x;
      fVar1 = (ppVar12->velocity).y;
      iVar11 = (int)((fVar13 * fVar13 + fVar1 * fVar1) * 1020.0);
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      circle.super_Shape.super_Drawable._vptr_Drawable =
           (_func_int **)
           CONCAT44((ppVar12->position).y - this->radius,(ppVar12->position).x - this->radius);
      sf::Color::Color((Color *)local_388,(byte)iVar11,'\0',~(byte)iVar11,0xff);
      uVar5 = local_388._0_8_;
      circle.super_Shape.super_Transformable._vptr_Transformable._0_1_ = local_388[0];
      circle.super_Shape.super_Transformable._vptr_Transformable._1_1_ = local_388[1];
      circle.super_Shape.super_Transformable._vptr_Transformable._2_1_ = local_388[2];
      circle.super_Shape.super_Transformable._vptr_Transformable._3_1_ = local_388[3];
      local_388._0_8_ = uVar5;
      sf::RenderTarget::draw
                (this_01,(Vertex *)&circle,1,Points,(RenderStates *)sf::RenderStates::Default);
    }
  }
  else {
    sf::CircleShape::CircleShape(&circle,this->radius,0x1e);
    fVar13 = 0.4 / fVar13 + 3.0;
    if (20.0 <= fVar13) {
      fVar13 = 20.0;
    }
    sf::CircleShape::setPointCount(&circle,(long)(int)fVar13);
    sf::CircleShape::setRadius(&circle,this->radius);
    pVVar7 = sf::View::getCenter(this_00);
    pVVar10 = sf::View::getSize(this_00);
    VVar2 = *pVVar10;
    VVar3 = *pVVar7;
    pVVar7 = sf::View::getSize(this_00);
    local_398 = VVar2.x;
    fStack_394 = VVar2.y;
    local_3a8 = VVar3.x;
    fStack_3a4 = VVar3.y;
    local_388._4_4_ = fStack_3a4 + fStack_394 * -0.5;
    local_388._0_4_ = local_3a8 + local_398 * -0.5;
    local_388._8_8_ = *pVVar7;
    ppVar4 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar12 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppVar12 != ppVar4; ppVar12 = ppVar12 + 1) {
      sf::Transformable::setPosition
                (&circle.super_Shape.super_Transformable,(ppVar12->position).x - this->radius,
                 (ppVar12->position).y - this->radius);
      local_378 = sf::Shape::getGlobalBounds(&circle.super_Shape);
      bVar6 = sf::Rect<float>::intersects((Rect<float> *)local_388,&local_378);
      if (bVar6) {
        fVar13 = (ppVar12->velocity).x;
        fVar1 = (ppVar12->velocity).y;
        iVar11 = (int)((fVar13 * fVar13 + fVar1 * fVar1) * 1020.0);
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        sf::Color::Color((Color *)&local_378,(byte)iVar11,'\0',~(byte)iVar11,0xff);
        sf::Shape::setFillColor(&circle.super_Shape,(Color *)&local_378);
        sf::RenderTarget::draw
                  (this_01,(Drawable *)&circle,(RenderStates *)sf::RenderStates::Default);
      }
    }
    sf::Shape::~Shape(&circle.super_Shape);
  }
  sf::Window::display((Window *)this);
  sf::Shape::~Shape(&rectangle.super_Shape);
  return;
}

Assistant:

void displ::drawParticles(const std::vector<particle>& p)const
{
	window.clear(sf::Color::Black);

	sf::RectangleShape rectangle;
	rectangle.setSize(sf::Vector2f(box.getX(), box.getY()));
	rectangle.setOutlineColor(sf::Color::White);
	rectangle.setFillColor(sf::Color::Transparent);
	rectangle.setOutlineThickness(box.getX() / 100.f);
	window.draw(rectangle);

	float doubledZoom = view.getSize().x/(float)window.getSize().x + view.getSize().y/(float)window.getSize().y;

	if (radius/doubledZoom*1.5f > 1.f)
	{
		//Kółka są widoczne

		sf::CircleShape circle(radius);

		//Dokładność kształtów rośnie z powiększaniem
		float vertices = 0.4f/doubledZoom + 3.f;
		vertices = vertices < 20.f ? vertices : 20.f;
		circle.setPointCount((int)vertices);

		circle.setRadius(radius);
		int temperature;
		sf::FloatRect viewBoundingBox(view.getCenter() - view.getSize()/2.f, view.getSize());
		for(const auto& i : p)
		{
			circle.setPosition(i.getPosition().getX() - radius, i.getPosition().getY() - radius);

			//Poza ekranem nie rysujemy
			if (!viewBoundingBox.intersects(circle.getGlobalBounds()))
				continue;

			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			circle.setFillColor(sf::Color(temperature, 0, 255 - temperature));
			window.draw(circle);
		}
	}
	else
	{
		//Kółka sprowadzają się do punktów
		sf::Vertex point;
		int temperature;
		for(const auto& i : p)
		{
			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			point.position = {i.getPosition().getX() - radius, i.getPosition().getY() - radius};
			point.color = sf::Color(temperature, 0, 255 - temperature);
			window.draw(&point, 1, sf::Points);
		}
	}
	window.display();
}